

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseHexColor(Parser *this,QColor *col)

{
  bool bVar1;
  char *pcVar2;
  QColor *in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  QColor QVar3;
  QString *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QAnyStringView *this_00;
  QAnyStringView in_stack_ffffffffffffff88;
  undefined8 local_50;
  undefined4 local_48;
  ushort uStack_44;
  QAnyStringView local_40 [2];
  undefined8 local_18;
  undefined4 local_10;
  ushort local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = local_40;
  lexem(in_RDI);
  QAnyStringView::QAnyStringView(this_00,(QString *)in_RDI);
  QVar3 = QColor::fromString(in_stack_ffffffffffffff88);
  local_50 = QVar3._0_8_;
  local_18 = local_50;
  local_48 = QVar3.ct._4_4_;
  local_10 = local_48;
  uStack_44 = QVar3.ct._8_2_;
  local_c = uStack_44;
  *(undefined8 *)in_RSI = local_50;
  *(undefined4 *)((long)&in_RSI->ct + 4) = local_48;
  (in_RSI->ct).argb.pad = uStack_44;
  QString::~QString((QString *)0xa3d87a);
  bVar1 = QColor::isValid(in_RSI);
  if (bVar1) {
    skipSpace((Parser *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,in_stack_ffffffffffffff34,
               (char *)in_stack_ffffffffffffff28);
    lexem(in_RDI);
    QString::toLatin1(in_stack_ffffffffffffff28);
    pcVar2 = QByteArray::constData((QByteArray *)0xa3d8c3);
    QMessageLogger::warning
              (&stack0xffffffffffffff90,"QCssParser::parseHexColor: Unknown color name \'%s\'",
               pcVar2);
    QByteArray::~QByteArray((QByteArray *)0xa3d8e3);
    QString::~QString((QString *)0xa3d8ed);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseHexColor(QColor *col)
{
    *col = QColor::fromString(lexem());
    if (!col->isValid()) {
        qWarning("QCssParser::parseHexColor: Unknown color name '%s'",lexem().toLatin1().constData());
        return false;
    }
    skipSpace();
    return true;
}